

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O2

void __thiscall
filtered_directed_graph_t::add_filtered_edge
          (filtered_directed_graph_t *this,vertex_index_t v,vertex_index_t w,value_t filtration)

{
  bool bVar1;
  value_t local_c;
  
  local_c = filtration;
  bVar1 = directed_graph_t::add_edge(&this->super_directed_graph_t,v,w);
  if ((bVar1) && ((filtration != -3.4028235e+38 || (NAN(filtration))))) {
    std::vector<float,_std::allocator<float>_>::push_back(&this->edge_filtration,&local_c);
  }
  return;
}

Assistant:

void add_filtered_edge(vertex_index_t v, vertex_index_t w, value_t filtration) {
		if (directed_graph_t::add_edge(v, w) && filtration != std::numeric_limits<value_t>::lowest())
			edge_filtration.push_back(filtration);
	}